

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O2

INT Silent_PAL_vsnprintf(LPSTR Buffer,INT Count,LPCSTR Format,__va_list_tag *aparg)

{
  long lVar1;
  LPCWSTR lpWideCharStr;
  BOOL BVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  errno_t eVar6;
  ulong uVar7;
  int *piVar8;
  short *psVar9;
  LPSTR pCVar10;
  byte *pbVar11;
  undefined8 *puVar12;
  size_t sVar13;
  uint *puVar14;
  WCHAR *pWVar15;
  LPSTR Count_00;
  char *__s;
  INT Count_01;
  INT Padding;
  int iVar16;
  uint uVar17;
  long lVar18;
  long in_FS_OFFSET;
  bool bVar19;
  undefined1 auStack_5e8 [8];
  CHAR TempBuffer [4];
  uint local_5c8;
  int local_5c4;
  INT Prefix;
  INT Type;
  char *local_5b8;
  LPCSTR Fmt;
  WCHAR local_5a6;
  uint local_5a4;
  WCHAR TempWChar;
  long lStack_5a0;
  INT Flags;
  uint local_598;
  int local_594;
  int iStack_590;
  INT Width;
  undefined1 auStack_588 [8];
  va_list ap;
  CHAR local_568 [8];
  CHAR TempStr [301];
  CHAR TempBuff [1024];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  auStack_588._0_4_ = aparg->gp_offset;
  auStack_588._4_4_ = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  lStack_5a0 = (long)Count;
  Fmt._4_4_ = -1;
  bVar19 = false;
  lVar18 = lStack_5a0;
  Prefix = Count;
  local_5b8 = Format;
  _iStack_590 = Buffer;
LAB_00142dd2:
  do {
    iVar16 = (int)Buffer;
    if (*local_5b8 == '\0') {
      bVar19 = !bVar19;
LAB_00143524:
      if ((long)_iStack_590 - (long)Buffer < lVar18) {
        *_iStack_590 = '\0';
      }
      if (bVar19) {
        Fmt._4_4_ = iStack_590 - iVar16;
      }
LAB_0014353f:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return Fmt._4_4_;
    }
    if (lVar18 <= (long)_iStack_590 - (long)Buffer) {
      bVar19 = false;
      goto LAB_00143524;
    }
    if ((*local_5b8 == '%') &&
       (BVar2 = Silent_ExtractFormatA
                          (&local_5b8,TempStr + 0x128,(LPINT)&local_5a4,&local_594,(LPINT)&local_598
                           ,(LPINT)&local_5c8,&local_5c4), iVar3 = local_594, uVar17 = local_5a4,
       iVar5 = local_5c4, uVar4 = local_5c8, BVar2 != 0)) {
      if (local_5c4 == 2 && (local_5c8 ^ 2) == 0) {
        if (local_594 == -3) {
          if ((uint)auStack_588._0_4_ < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar5 = -3;
        }
        else {
          iVar5 = local_594;
          if (local_594 == -2) {
            uVar7 = (ulong)auStack_588 & 0xffffffff;
            if (uVar7 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              piVar8 = (int *)(uVar7 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar8 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            iVar5 = *piVar8;
            local_594 = iVar5;
          }
        }
        uVar7 = (ulong)auStack_588 & 0xffffffff;
        if (local_598 == 0xfffffffc) {
          if ((uint)auStack_588._0_4_ < 0x29) {
            uVar7 = (ulong)(auStack_588._0_4_ + 8);
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            uVar4 = 0xfffffffc;
            goto LAB_00143029;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
          uVar4 = 0xfffffffc;
LAB_0014304d:
          puVar12 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
          uVar4 = local_598;
          if (local_598 == 0xfffffffe) {
            if ((uint)auStack_588._0_4_ < 0x29) {
              puVar14 = (uint *)((long)ap[0].overflow_arg_area + uVar7);
              uVar7 = (ulong)(auStack_588._0_4_ + 8);
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
            }
            else {
              puVar14 = (uint *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            uVar4 = *puVar14;
          }
LAB_00143029:
          if (0x28 < (uint)uVar7) goto LAB_0014304d;
          auStack_588._0_4_ = (uint)uVar7 + 8;
          puVar12 = (undefined8 *)(uVar7 + (long)ap[0].overflow_arg_area);
        }
        lpWideCharStr = (LPCWSTR)*puVar12;
        iVar3 = Silent_WideCharToMultiByte(lpWideCharStr,-1,(LPSTR)0x0,0);
        if (iVar3 == 0) goto LAB_0014353f;
        if (uVar4 == 0xfffffffd) {
          uVar4 = 300;
        }
        uVar17 = iVar3 - 1;
        local_598 = uVar4;
        if (((int)uVar4 < 1) || ((int)uVar17 <= (int)uVar4)) {
          iVar3 = Silent_WideCharToMultiByte(lpWideCharStr,-1,local_568,iVar3);
          if (iVar3 == 0) {
            PAL_free(local_568);
            goto LAB_0014353f;
          }
        }
        else {
          iVar3 = Silent_WideCharToMultiByte(lpWideCharStr,uVar4,local_568,iVar3);
          if (iVar3 == 0) goto LAB_0014353f;
          local_568[iVar3] = '\0';
          uVar17 = uVar4;
        }
        __s = local_568;
        Padding = iVar5 - uVar17;
        Count_01 = (iVar16 - iStack_590) + Prefix;
        uVar17 = local_5a4;
        Count = Prefix;
      }
      else {
        if ((local_5c8 ^ 2) != 0 || local_5c4 != 1) {
          lVar18 = lStack_5a0;
          if (local_5c4 == 6) {
            if (local_594 == -2) {
              uVar7 = (ulong)auStack_588 & 0xffffffff;
              if (uVar7 < 0x29) {
                auStack_588._0_4_ = auStack_588._0_4_ + 8;
                piVar8 = (int *)(uVar7 + (long)ap[0].overflow_arg_area);
              }
              else {
                piVar8 = (int *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              local_594 = *piVar8;
            }
            if (local_598 == 0xfffffffe) {
              uVar7 = (ulong)auStack_588 & 0xffffffff;
              if (uVar7 < 0x29) {
                auStack_588._0_4_ = auStack_588._0_4_ + 8;
                puVar14 = (uint *)(uVar7 + (long)ap[0].overflow_arg_area);
              }
              else {
                puVar14 = (uint *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              local_598 = *puVar14;
            }
            uVar7 = (ulong)auStack_588 & 0xffffffff;
            if (local_5c8 == 1) {
              if ((uint)auStack_588._0_4_ < 0x29) {
                auStack_588._0_4_ = auStack_588._0_4_ + 8;
                puVar12 = (undefined8 *)(uVar7 + (long)ap[0].overflow_arg_area);
              }
              else {
                puVar12 = (undefined8 *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              *(short *)*puVar12 = (short)((long)_iStack_590 - (long)Buffer);
            }
            else {
              if ((uint)auStack_588._0_4_ < 0x29) {
                auStack_588._0_4_ = auStack_588._0_4_ + 8;
                puVar12 = (undefined8 *)(uVar7 + (long)ap[0].overflow_arg_area);
              }
              else {
                puVar12 = (undefined8 *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              *(int *)*puVar12 = (int)((long)_iStack_590 - (long)Buffer);
            }
            goto LAB_00142dd2;
          }
          if (local_5c4 == 1) {
            if ((local_5a4 & 4) != 0) {
              uVar7 = (ulong)auStack_588 & 0xffffffff;
              if (uVar7 < 0x29) {
                auStack_588._0_4_ = auStack_588._0_4_ + 8;
                pbVar11 = (byte *)(uVar7 + (long)ap[0].overflow_arg_area);
              }
              else {
                pbVar11 = (byte *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              auStack_5e8[1] = 0;
              auStack_5e8[0] = *pbVar11;
              BVar2 = Internal_AddPaddingA
                                ((LPSTR *)&stack0xfffffffffffffa70,(iVar16 - iStack_590) + Count,
                                 auStack_5e8,local_594 + -1,local_5a4);
              bVar19 = BVar2 == 0;
              goto LAB_00142dd2;
            }
          }
          else if ((local_5c4 == 2) && ((local_5a4 & 4) != 0)) {
            uVar7 = (ulong)auStack_588 & 0xffffffff;
            if (uVar7 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              puVar12 = (undefined8 *)(uVar7 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar12 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            __s = (char *)*puVar12;
            sVar13 = strlen(__s);
            Count_01 = (iVar16 - iStack_590) + Count;
            Padding = local_594 - (int)sVar13;
            goto LAB_00143241;
          }
          Count_00 = Buffer + (lStack_5a0 - (long)_iStack_590);
          if ((local_5c4 == 5 && (local_5c8 ^ 1) == 0) || ((local_5c8 ^ 1) == 0 && local_5c4 == 4))
          {
            uVar7 = (ulong)auStack_588 & 0xffffffff;
            if (uVar7 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              psVar9 = (short *)(uVar7 + (long)ap[0].overflow_arg_area);
            }
            else {
              psVar9 = (short *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            uVar4 = snprintf(_iStack_590,(size_t)Count_00,TempStr + 0x128,(ulong)(uint)(int)*psVar9)
            ;
          }
          else {
            if (((TempStr[0x128] == '%') && (TempStr[0x129] == 's')) &&
               (eVar6 = strcpy_s(TempStr + 0x128,0x400,"%.300s"), eVar6 != 0)) goto LAB_0014353f;
            auStack_5e8 = auStack_588;
            _TempBuffer = (void *)ap[0]._0_8_;
            Type = PAL__vsnprintf(_iStack_590,(size_t)Count_00,TempStr + 0x128,
                                  (__va_list_tag *)auStack_5e8);
            PAL_printf_arg_remover((va_list *)auStack_588,local_594,local_598,iVar5,uVar4);
            lVar18 = lStack_5a0;
            uVar4 = Type;
          }
          if (((int)uVar4 < 0) || (pCVar10 = (LPSTR)(ulong)uVar4, Count_00 <= pCVar10)) {
            bVar19 = true;
            pCVar10 = Count_00;
          }
          _iStack_590 = _iStack_590 + (long)pCVar10;
          goto LAB_00142dd2;
        }
        uVar4 = auStack_588._0_4_;
        if (local_594 + 3U < 2) {
          if ((uint)auStack_588._0_4_ < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            uVar4 = auStack_588._0_4_;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        __s = auStack_5e8;
        if ((local_598 & 0xfffffffd) == 0xfffffffc) {
          if (uVar4 < 0x29) {
            uVar4 = uVar4 + 8;
            auStack_588._0_4_ = uVar4;
            goto LAB_0014313c;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_001431d9:
          pWVar15 = (WCHAR *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
LAB_0014313c:
          if (0x28 < uVar4) goto LAB_001431d9;
          auStack_588._0_4_ = uVar4 + 8;
          pWVar15 = (WCHAR *)((ulong)uVar4 + (long)ap[0].overflow_arg_area);
        }
        local_5a6 = *pWVar15;
        iVar5 = Silent_WideCharToMultiByte(&local_5a6,1,__s,4);
        if (iVar5 == 0) goto LAB_0014353f;
        TempBuffer[(long)iVar5 + -8] = '\0';
        Count_01 = (iVar16 - iStack_590) + Count;
        Padding = iVar3 - iVar5;
        uVar17 = local_5a4;
      }
LAB_00143241:
      BVar2 = Internal_AddPaddingA((LPSTR *)&stack0xfffffffffffffa70,Count_01,__s,Padding,uVar17);
      bVar19 = BVar2 == 0;
      lVar18 = lStack_5a0;
      goto LAB_00142dd2;
    }
    *_iStack_590 = *local_5b8;
    local_5b8 = local_5b8 + 1;
    _iStack_590 = _iStack_590 + 1;
  } while( true );
}

Assistant:

INT Silent_PAL_vsnprintf(LPSTR Buffer, INT Count, LPCSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPSTR BufferPtr = Buffer;
    LPCSTR Fmt = Format;
    LPWSTR TempWStr;
    CHAR TempStr[MAX_STR_LEN+1];
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    va_list ap;
    
    va_copy(ap, aparg);

    while (*Fmt)
    {
        if ((BufferPtr - Buffer) >= Count)
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Silent_ExtractFormatA(&Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = Silent_WideCharToMultiByte(TempWStr, -1, 0, 0);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }

                /* clip string output to MAX_STR_LEN characters */
                if (PRECISION_DOT == Precision)
                {
                    Precision = MAX_STR_LEN;
                }

                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = Silent_WideCharToMultiByte(TempWStr, Precision, 
                                                        TempStr, Length);
                    if (!Length)
                    {
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = Silent_WideCharToMultiByte(TempWStr, -1,
                                                              TempStr, Length);
                    if (!wctombResult)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempStr,
                                                   Width - Length,
                                                   Flags);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[4];

                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = Silent_WideCharToMultiByte(&TempWChar, 1, TempBuffer, 4);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempBuffer,
                                                   Width - Length,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           ch,
                                           Width - Length,
                                           Flags);
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           tempStr,
                                           Width - Length,
                                           Flags);
            }
            /* types that sprintf can handle */
            else
            {
                size_t TempCount = Count - (BufferPtr - Buffer);

                TempInt = 0;
                /* %h (short) doesn't seem to be handled properly by local sprintf,
                   so lets do the truncation ourselves.  (ptr -> int -> short to avoid
                   warnings */
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, trunc2);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    /* limit string output (%s) to 300 characters */
                    if(TempBuff[0] == '%' && TempBuff[1] == 's')
                    {
                        if (strcpy_s(TempBuff, sizeof(TempBuff), "%.300s") != SAFECRT_SUCCESS)
                        {
                            va_end(ap);
                            return -1;
                        }
                    }                                     
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = PAL__vsnprintf(BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    BufferPtr += TempInt;
                }
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (Count > (BufferPtr - Buffer))
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}